

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O3

Gia_Man_t * Gia_SweeperFraigTest(Gia_Man_t *pInit,int nWords,int nConfs,int fVerbose)

{
  int iVar1;
  Gia_Man_t *pGia;
  Vec_Int_t *vProbeOuts;
  int *piVar2;
  Gia_Man_t *pGVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  
  pGia = Gia_ManDupOneHot(pInit);
  Gia_SweeperStart(pGia);
  pVVar7 = pGia->vCos;
  uVar9 = (ulong)(uint)pVVar7->nSize;
  uVar5 = pVVar7->nSize - pGia->nRegs;
  uVar6 = (ulong)uVar5;
  vProbeOuts = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar4 = uVar5;
  }
  vProbeOuts->nSize = 0;
  vProbeOuts->nCap = uVar4;
  if (uVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)(int)uVar4 << 2);
  }
  vProbeOuts->pArray = piVar2;
  if (0 < (int)uVar5) {
    lVar8 = 0;
    do {
      if ((int)uVar9 <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar7->pArray[lVar8];
      if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(uint *)(pGia->pObjs + iVar1);
      iVar1 = iVar1 - (uVar4 & 0x1fffffff);
      if (lVar8 < (long)(int)uVar6 - (long)pGia->nConstrs) {
        if (iVar1 < 0) {
LAB_0077f1bc:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        iVar1 = Gia_SweeperProbeCreate(pGia,(uVar4 >> 0x1d & 1) + iVar1 * 2);
        pVVar7 = vProbeOuts;
      }
      else {
        if (iVar1 < 0) goto LAB_0077f1bc;
        iVar1 = Gia_SweeperProbeCreate(pGia,(uVar4 >> 0x1d & 1) + iVar1 * 2);
        pVVar7 = *(Vec_Int_t **)((long)pGia->pData + 0x18);
      }
      Vec_IntPush(pVVar7,iVar1);
      lVar8 = lVar8 + 1;
      pVVar7 = pGia->vCos;
      uVar9 = (ulong)pVVar7->nSize;
      uVar6 = uVar9 - (long)pGia->nRegs;
    } while (lVar8 < (long)uVar6);
  }
  pGVar3 = Gia_SweeperSweep(pGia,vProbeOuts,nWords,nConfs,fVerbose,0);
  if (vProbeOuts->pArray != (int *)0x0) {
    free(vProbeOuts->pArray);
  }
  free(vProbeOuts);
  Gia_SweeperStop(pGia);
  Gia_ManStop(pGia);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_SweeperFraigTest( Gia_Man_t * pInit, int nWords, int nConfs, int fVerbose )
{
    Gia_Man_t * p, * pGia;
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    int i;
    // add one-hotness constraints
    p = Gia_ManDupOneHot( pInit );
    // create sweeper
    Gia_SweeperStart( p );
    // collect outputs and create conditions
    vOuts = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
        if ( i < Gia_ManPoNum(p) - p->nConstrs )  // this is the user's output
            Vec_IntPush( vOuts, Gia_SweeperProbeCreate( p,  Gia_ObjFaninLit0p(p, pObj) ) );
        else // this is a constraint
            Gia_SweeperCondPush( p, Gia_SweeperProbeCreate( p, Gia_ObjFaninLit0p(p, pObj) ) );
    // perform the sweeping
    pGia = Gia_SweeperSweep( p, vOuts, nWords, nConfs, fVerbose, 0 );
//    pGia = Gia_ManDup( p );
    Vec_IntFree( vOuts );
    // sop the sweeper
    Gia_SweeperStop( p );
    Gia_ManStop( p );
    return pGia;
}